

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_layout_handle
          (Impl *this,Value *state,VkPipelineLayout *out_layout)

{
  ulong uVar1;
  bool bVar2;
  Ch *__nptr;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  long *in_FS_OFFSET;
  
  __nptr = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(state);
  p_Var3 = (_Hash_node_base *)strtoull(__nptr,(char **)0x0,0x10);
  if (p_Var3 == (_Hash_node_base *)0x0) {
    *out_layout = (VkPipelineLayout)0x0;
  }
  else {
    uVar1 = (this->replayed_pipeline_layouts)._M_h._M_bucket_count;
    uVar5 = (ulong)p_Var3 % uVar1;
    p_Var6 = (this->replayed_pipeline_layouts)._M_h._M_buckets[uVar5];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var6->_M_nxt, p_Var7 = p_Var6, p_Var3 != p_Var6->_M_nxt[1]._M_nxt)) {
      while (p_Var6 = p_Var4, p_Var4 = p_Var6->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar5) ||
           (p_Var7 = p_Var6, p_Var3 == p_Var4[1]._M_nxt)) goto LAB_001254cf;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_001254cf:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var7->_M_nxt;
    }
    if ((p_Var4 == (_Hash_node_base *)0x0) ||
       ((VkPipelineLayout)p_Var4[2]._M_nxt == (VkPipelineLayout)0x0)) {
      if (1 < *(int *)(*in_FS_OFFSET + -0x18)) {
        return false;
      }
      bVar2 = Internal::log_thread_callback
                        (LOG_DEFAULT,
                         "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                         ,"Pipeline layout",p_Var3);
      if (bVar2) {
        return false;
      }
      fprintf(_stderr,
              "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
              ,"Pipeline layout",p_Var3);
      return false;
    }
    *out_layout = (VkPipelineLayout)p_Var4[2]._M_nxt;
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_layout_handle(const Value &state, VkPipelineLayout *out_layout)
{
	auto layout = string_to_uint64(state.GetString());
	if (layout > 0)
	{
		auto layout_itr = replayed_pipeline_layouts.find(layout);
		if (layout_itr == end(replayed_pipeline_layouts) || layout_itr->second == VK_NULL_HANDLE)
		{
			log_missing_resource("Pipeline layout", layout);
			return false;
		}
		else
			*out_layout = layout_itr->second;
	}
	else
		*out_layout = VK_NULL_HANDLE;

	return true;
}